

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void Configtable_clear(_func_int_config_ptr *f)

{
  s_x4 *psVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  
  if ((x4a != (s_x4 *)0x0) && (iVar2 = x4a->count, iVar2 != 0)) {
    if (f != (_func_int_config_ptr *)0x0) {
      lVar5 = 0;
      for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
        (*f)(*(config **)((long)&x4a->tbl->data + lVar5));
        iVar2 = x4a->count;
        lVar5 = lVar5 + 0x18;
      }
    }
    psVar1 = x4a;
    uVar4 = 0;
    uVar3 = (ulong)(uint)x4a->size;
    if (x4a->size < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      psVar1->ht[uVar4] = (s_x4node *)0x0;
    }
    psVar1->count = 0;
  }
  return;
}

Assistant:

void Configtable_clear(int(*f)(struct config *))
{
  int i;
  if( x4a==0 || x4a->count==0 ) return;
  if( f ) for(i=0; i<x4a->count; i++) (*f)(x4a->tbl[i].data);
  for(i=0; i<x4a->size; i++) x4a->ht[i] = 0;
  x4a->count = 0;
  return;
}